

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcOccupant::~IfcOccupant(IfcOccupant *this)

{
  undefined1 *puVar1;
  
  *(undefined ***)&(this->super_IfcActor).super_IfcObject = &PTR__IfcOccupant_008156a0;
  *(undefined ***)&this->field_0x120 = &PTR__IfcOccupant_00815768;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject.field_0x88 = &PTR__IfcOccupant_008156c8;
  (this->super_IfcActor).super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>
  ._vptr_ObjectHelper = (_func_int **)&PTR__IfcOccupant_008156f0;
  *(undefined ***)&(this->super_IfcActor).super_IfcObject.field_0xd0 = &PTR__IfcOccupant_00815718;
  *(undefined ***)&(this->super_IfcActor).field_0xf0 = &PTR__IfcOccupant_00815740;
  puVar1 = *(undefined1 **)&(this->super_IfcActor).field_0x100;
  if (puVar1 != &this->field_0x110) {
    operator_delete(puVar1,*(long *)&this->field_0x110 + 1);
  }
  IfcActor::~IfcActor(&this->super_IfcActor,&PTR_construction_vtable_24__00815780);
  operator_delete(this,0x138);
  return;
}

Assistant:

IfcOccupant() : Object("IfcOccupant") {}